

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O3

void __thiscall
ft::deque<int,ft::allocator<int>>::assign<ft::constDequeIterator<int,64ul>>
          (deque<int,ft::allocator<int>> *this,constDequeIterator<int,_64UL> *first,
          constDequeIterator<int,_64UL> *last,type *param_3)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pvVar6;
  long lVar7;
  map_pointer ppvVar8;
  pointer val;
  pointer pvVar9;
  map_pointer ppvVar10;
  
  deque<int,_ft::allocator<int>_>::clear((deque<int,_ft::allocator<int>_> *)this);
  pvVar2 = (first->super_dequeIterator<int,_64UL>).m_cur;
  pvVar6 = (first->super_dequeIterator<int,_64UL>).m_first;
  pvVar9 = (first->super_dequeIterator<int,_64UL>).m_last;
  ppvVar8 = (first->super_dequeIterator<int,_64UL>).m_node;
  pvVar1 = (last->super_dequeIterator<int,_64UL>).m_cur;
  lVar3 = (long)(last->super_dequeIterator<int,_64UL>).m_node - (long)ppvVar8;
  lVar7 = ((long)pvVar9 - (long)pvVar2 >> 2) +
          ((long)pvVar1 - (long)(last->super_dequeIterator<int,_64UL>).m_first >> 2);
  lVar3 = ((lVar7 + lVar3 * 8) - (lVar7 + lVar3 * 8 + -0x40 >> 0x3f)) + -0x40 >> 1;
  uVar4 = ((long)pvVar2 - (long)pvVar6 >> 2) + lVar3;
  if ((long)uVar4 < 0) {
    uVar5 = (long)uVar4 >> 6;
LAB_00108f21:
    ppvVar10 = ppvVar8 + uVar5;
    val = *ppvVar10 + uVar4 + uVar5 * -0x40;
    pvVar9 = *ppvVar10 + 0x40;
  }
  else {
    if (0x3f < uVar4) {
      uVar5 = uVar4 >> 6;
      goto LAB_00108f21;
    }
    val = pvVar2 + lVar3;
    ppvVar10 = ppvVar8;
  }
  if (val != pvVar1) {
    do {
      deque<int,_ft::allocator<int>_>::push_back((deque<int,_ft::allocator<int>_> *)this,val);
      val = val + 1;
      if (val == pvVar9) {
        val = ppvVar10[1];
        ppvVar10 = ppvVar10 + 1;
        pvVar9 = val + 0x40;
      }
    } while (val != (last->super_dequeIterator<int,_64UL>).m_cur);
    pvVar2 = (first->super_dequeIterator<int,_64UL>).m_cur;
    pvVar6 = (first->super_dequeIterator<int,_64UL>).m_first;
    ppvVar8 = (first->super_dequeIterator<int,_64UL>).m_node;
    lVar7 = (long)(last->super_dequeIterator<int,_64UL>).m_node - (long)ppvVar8;
    lVar3 = ((long)(first->super_dequeIterator<int,_64UL>).m_last - (long)pvVar2 >> 2) +
            ((long)val - (long)(last->super_dequeIterator<int,_64UL>).m_first >> 2);
    lVar3 = ((lVar3 + lVar7 * 8) - (lVar3 + lVar7 * 8 + -0x40 >> 0x3f)) + -0x40 >> 1;
    uVar4 = ((long)pvVar2 - (long)pvVar6 >> 2) + lVar3;
  }
  if ((long)uVar4 < 0) {
    uVar5 = (long)uVar4 >> 6;
  }
  else {
    if (uVar4 < 0x40) {
      pvVar9 = pvVar2 + lVar3;
      goto LAB_0010900d;
    }
    uVar5 = uVar4 >> 6;
  }
  ppvVar8 = ppvVar8 + uVar5;
  pvVar6 = *ppvVar8;
  pvVar9 = pvVar6 + uVar4 + uVar5 * -0x40;
LAB_0010900d:
  if (pvVar9 != pvVar2) {
    do {
      if (pvVar9 == pvVar6) {
        pvVar6 = ppvVar8[-1];
        ppvVar8 = ppvVar8 + -1;
        pvVar9 = pvVar6 + 0x40;
      }
      pvVar9 = pvVar9 + -1;
      deque<int,_ft::allocator<int>_>::push_front((deque<int,_ft::allocator<int>_> *)this,pvVar9);
    } while (pvVar9 != (first->super_dequeIterator<int,_64UL>).m_cur);
  }
  return;
}

Assistant:

void assign(Iterator first, Iterator last,
				typename ft::_void_t<typename ft::iterator_traits<Iterator>::iterator_category>::type * = 0) {
		this->clear();

		Iterator	middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != last) {
			this->push_back(*middle);
			++middle;
		}

		middle = ft::next(first, ft::distance(first, last) / 2);
		while (middle != first) {
			--middle;
			this->push_front(*middle);
		}
	}